

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O3

int minTemp1_fast(word *pInOut,int iVar,int nWords,int *pDifStart)

{
  int iVar1;
  int iVar2;
  int blockSize;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  blockSize = 1 << ((byte)iVar & 0x1f);
  iVar1 = 2 << ((byte)iVar & 0x1f);
  uVar3 = (ulong)(uint)nWords;
  iVar2 = nWords * 100 + 0x14;
  while( true ) {
    if ((int)uVar3 < 1) {
      *pDifStart = 0;
      return 1;
    }
    if (0x3f < iVar1) break;
    uVar5 = (SFmask[iVar][1] & pInOut[uVar3 - 1]) << ((byte)blockSize & 0x3f);
    uVar4 = (pInOut[uVar3 - 1] & SFmask[iVar][2]) << ((byte)iVar1 & 0x3f);
    iVar2 = iVar2 + -100;
    uVar3 = uVar3 - 1;
    if (uVar5 != uVar4) {
      iVar1 = firstShiftWithOneBit(uVar4 ^ uVar5,blockSize);
      *pDifStart = iVar2 - iVar1;
      return 2 - (uint)(uVar5 < uVar4);
    }
  }
  __assert_fail("2*blockSize < 64",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast16.c"
                ,0xa3,"int minTemp1_fast(word *, int, int, int *)");
}

Assistant:

int minTemp1_fast(word* pInOut, int iVar, int nWords, int* pDifStart)
{
    int i, blockSize = 1<<iVar;
    word temp;
    for(i=nWords - 1; i>=0; i--)
    {
        assert( 2*blockSize < 64 );
        temp = ((pInOut[i] & SFmask[iVar][1])<<(blockSize)) ^ ((pInOut[i] & SFmask[iVar][2])<<(2*blockSize));
        if( temp == 0)
            continue;
        else
        {
            *pDifStart = i*100 + 20 - firstShiftWithOneBit(temp, blockSize);
            if( ((pInOut[i] & SFmask[iVar][1])<<(blockSize)) < ((pInOut[i] & SFmask[iVar][2])<<(2*blockSize)) )
                return 1;
            else
                return 2;
        }
    }
    *pDifStart=0;
    return 1;
}